

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Pointer *type)

{
  UnsupportedType *this_00;
  string local_40;
  
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"pointer types are not supported for export in IDL","");
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_40);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Pointer const& type)
    { throw UnsupportedType(type, "pointer types are not supported for export in IDL"); }